

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Generic_Floor(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  bool bVar1;
  EFloor floortype;
  undefined *puVar2;
  
  floortype = floorRaiseByValue - ((arg4 & 8U) == 0);
  if (arg3 - 1U < 6) {
    puVar2 = &DAT_005cfbb0;
    if ((arg4 & 8U) == 0) {
      puVar2 = &DAT_005cfbc8;
    }
    floortype = *(EFloor *)(puVar2 + (ulong)(arg3 - 1U) * 4);
  }
  bVar1 = EV_DoFloor(floortype,(line_t_conflict *)ln,arg0,(double)arg1 * 0.125,(double)arg2,
                     -(uint)((arg4 & 0x10U) == 0) | 0x14,arg4 & 7,false,false);
  return (int)bVar1;
}

Assistant:

FUNC(LS_Generic_Floor)
// Generic_Floor (tag, speed, height, target, change/model/direct/crush)
{
	DFloor::EFloor type;

	if (arg4 & 8)
	{
		switch (arg3)
		{
			case 1: type = DFloor::floorRaiseToHighest;			break;
			case 2: type = DFloor::floorRaiseToLowest;			break;
			case 3: type = DFloor::floorRaiseToNearest;			break;
			case 4: type = DFloor::floorRaiseToLowestCeiling;	break;
			case 5: type = DFloor::floorRaiseToCeiling;			break;
			case 6: type = DFloor::floorRaiseByTexture;			break;
			default:type = DFloor::floorRaiseByValue;			break;
		}
	}
	else
	{
		switch (arg3)
		{
			case 1: type = DFloor::floorLowerToHighest;			break;
			case 2: type = DFloor::floorLowerToLowest;			break;
			case 3: type = DFloor::floorLowerToNearest;			break;
			case 4: type = DFloor::floorLowerToLowestCeiling;	break;
			case 5: type = DFloor::floorLowerToCeiling;			break;
			case 6: type = DFloor::floorLowerByTexture;			break;
			default:type = DFloor::floorLowerByValue;			break;
		}
	}

	return EV_DoFloor (type, ln, arg0, SPEED(arg1), arg2,
					   (arg4 & 16) ? 20 : -1, arg4 & 7, false);
					   
}